

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint *puVar1;
  uint32 gau_begin_00;
  int iVar2;
  uint uVar3;
  cmd_ln_t *pcVar4;
  char *pcVar5;
  char *fn;
  char *pcVar6;
  char *pcVar7;
  char *mllrmatfn;
  char *cb2mllrfn;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint32 n_mgau_rd;
  uint32 n_feat_rd;
  uint32 n_mllr_class;
  uint32 n_density;
  uint32 n_mgau_rd_1;
  uint32 n_mgau;
  undefined4 uStack_9c;
  int32 *cb2mllr;
  uint32 *veclen;
  vector_t ***mean;
  uint32 n_feat;
  char *local_78;
  float32 ***B;
  float32 ****A;
  uint32 *veclen_rd;
  model_def_t *mdef;
  uint32 gau_begin;
  uint32 n_mllr_class_1;
  uint32 n_feat_rd_1;
  char *local_40;
  long local_38;
  
  printf("----- Compiled on %s, %s\n\n","Apr 26 2025","22:31:23");
  parse_cmd_ln(argc,argv);
  pcVar4 = cmd_ln_get();
  pcVar5 = cmd_ln_str_r(pcVar4,"-outmeanfn");
  pcVar4 = cmd_ln_get();
  fn = cmd_ln_str_r(pcVar4,"-inmeanfn");
  pcVar4 = cmd_ln_get();
  pcVar6 = cmd_ln_str_r(pcVar4,"-outgaucntfn");
  pcVar4 = cmd_ln_get();
  pcVar7 = cmd_ln_str_r(pcVar4,"-ingaucntfn");
  pcVar4 = cmd_ln_get();
  mllrmatfn = cmd_ln_str_r(pcVar4,"-mllrmat");
  pcVar4 = cmd_ln_get();
  cb2mllrfn = cmd_ln_str_r(pcVar4,"-cb2mllrfn");
  pcVar4 = cmd_ln_get();
  local_40 = cmd_ln_str_r(pcVar4,"-moddeffn");
  pcVar4 = cmd_ln_get();
  local_38 = cmd_ln_int_r(pcVar4,"-cdonly");
  pcVar4 = cmd_ln_get();
  lVar8 = cmd_ln_int_r(pcVar4,"-inverse");
  if ((mllrmatfn == (char *)0x0) || (cb2mllrfn == (char *)0x0)) {
    pcVar7 = "You must specify all mllr files\n";
    lVar8 = 0x160;
LAB_00102b72:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
            ,lVar8,pcVar7);
    goto LAB_001029e6;
  }
  if (pcVar5 == (char *)0x0) {
    local_78 = pcVar6;
    if (pcVar6 == (char *)0x0) {
      pcVar7 = "No -outmeanfn or -outgaucntfn given, nothing done.\n";
      lVar8 = 0x183;
      goto LAB_00102b72;
    }
    mdef = (model_def_t *)0x0;
    mean = (vector_t ***)0x0;
    veclen = (uint32 *)0x0;
    veclen_rd = (uint32 *)0x0;
    cb2mllr = (int32 *)0x0;
    A = (float32 ****)0x0;
    B = (float32 ***)0x0;
    _n_mgau = (float32 ****)0x0;
    _n_feat = (float32 ***)0x0;
    read_mllr_files(mllrmatfn,cb2mllrfn,(float32 *****)&n_mgau,(float32 ****)&n_feat,(int32 **)&B,
                    &n_mllr_class_1,&n_mgau_rd,&n_feat_rd,(uint32 **)&cb2mllr,(uint32)lVar8);
    fputc(10,_stderr);
    iVar2 = s3gaucnt_read(pcVar7,&mean,(vector_t ****)&veclen,(int32 *)&n_density,
                          (float32 ****)&veclen_rd,&n_mgau_rd_1,&n_feat_rd_1,&n_mllr_class,
                          (uint32 **)&A);
    pcVar5 = local_78;
    if (iVar2 != 0) {
      pcVar6 = "Unable to read Gaussian counts from %s\n";
      lVar8 = 0x115;
      goto LAB_00102bcd;
    }
    uVar10 = (ulong)n_mgau_rd_1;
    if (n_mgau_rd == 0) {
      n_mgau_rd = n_mgau_rd_1;
    }
    else if (n_mgau_rd_1 != n_mgau_rd) {
      pcVar7 = "# means %u inconsistent w/ cb2mllr # cb %u\n";
      lVar8 = 0x11b;
      goto LAB_001029df;
    }
    uVar10 = (ulong)n_feat_rd_1;
    if (n_feat_rd_1 == n_feat_rd) {
      uVar9 = 0;
      do {
        if (uVar10 == uVar9) {
          ckd_free(A);
          gau_begin = 0;
          if ((int)local_38 != 0) {
            read_mdef(local_40,&mdef,&gau_begin,(int32 *)B);
          }
          fputc(10,_stderr);
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
                  ,0x12e,"Adapt mean values.\n");
          mllr_transform_mean(mean,(vector_t ***)0x0,0,n_mgau_rd,n_feat_rd,n_mllr_class,
                              (uint32 *)cb2mllr,_n_mgau,_n_feat,(int32 *)B,n_mllr_class_1);
          fputc(10,_stderr);
          iVar2 = s3gaucnt_write(pcVar5,mean,(vector_t ***)veclen,n_density,(float32 ***)veclen_rd,
                                 n_mgau_rd,n_feat_rd,n_mllr_class,(uint32 *)cb2mllr);
          if (iVar2 != 0) {
            pcVar6 = "Unable to write Gaussian counts to %s\n";
            lVar8 = 0x140;
            pcVar7 = pcVar5;
            goto LAB_00102bcd;
          }
          lVar8 = 0x17a;
          goto LAB_00102acd;
        }
        uVar3 = *(uint *)((long)A + uVar9 * 4);
        puVar1 = (uint *)(cb2mllr + uVar9);
        uVar9 = uVar9 + 1;
      } while (uVar3 == *puVar1);
      lVar8 = 0x123;
      goto LAB_001029dc;
    }
    lVar8 = 0x11e;
LAB_00102baf:
    pcVar7 = "# feature stream inconsistent. (%u : %u)\n";
  }
  else {
    mdef = (model_def_t *)0x0;
    mean = (vector_t ***)0x0;
    veclen = (uint32 *)0x0;
    veclen_rd = (uint32 *)0x0;
    cb2mllr = (int32 *)0x0;
    A = (float32 ****)0x0;
    B = (float32 ***)0x0;
    local_78 = pcVar5;
    read_mllr_files(mllrmatfn,cb2mllrfn,&A,&B,&cb2mllr,&n_mllr_class,&n_mgau,&n_feat,&veclen,
                    (uint32)lVar8);
    fputc(10,_stderr);
    iVar2 = s3gau_read(fn,&mean,&n_mgau_rd,&n_feat_rd,&n_density,&veclen_rd);
    if (iVar2 != 0) {
      pcVar6 = "Unable to read Gaussian means from %s\n";
      lVar8 = 0xb7;
      pcVar7 = fn;
LAB_00102bcd:
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
              ,lVar8,pcVar6,pcVar7);
      goto LAB_001029e6;
    }
    uVar10 = (ulong)n_mgau_rd;
    if (n_mgau == 0) {
      _n_mgau = (float32 ****)CONCAT44(uStack_9c,n_mgau_rd);
LAB_0010285f:
      uVar10 = (ulong)n_feat_rd;
      if (n_feat_rd != n_feat) {
        lVar8 = 0xc0;
        goto LAB_00102baf;
      }
      uVar9 = 0;
      do {
        if (uVar10 == uVar9) {
          ckd_free(veclen_rd);
          n_mgau_rd_1 = 0;
          if ((int)local_38 != 0) {
            read_mdef(local_40,&mdef,&n_mgau_rd_1,cb2mllr);
          }
          gau_begin_00 = n_mgau_rd_1;
          fputc(10,_stderr);
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
                  ,0xd0,"Adapt mean values.\n");
          mllr_transform_mean(mean,(vector_t ***)0x0,gau_begin_00,n_mgau,n_feat,n_density,veclen,A,B
                              ,cb2mllr,n_mllr_class);
          fputc(10,_stderr);
          pcVar7 = local_78;
          iVar2 = s3gau_write(local_78,mean,n_mgau,n_feat,n_density,veclen);
          if (iVar2 == 0) {
            lVar8 = 0x16a;
LAB_00102acd:
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
                    ,lVar8,"mllr_adapt finished successfully.\n");
            return 0;
          }
          pcVar6 = "Unable to write Gaussian means to %s\n";
          lVar8 = 0xdd;
          goto LAB_00102bcd;
        }
        uVar3 = veclen_rd[uVar9];
        puVar1 = veclen + uVar9;
        uVar9 = uVar9 + 1;
      } while (uVar3 == *puVar1);
      lVar8 = 0xc5;
LAB_001029dc:
      pcVar7 = "veclen inconsistent. (%u : %u)\n";
      uVar10 = (ulong)uVar3;
    }
    else {
      if (n_mgau_rd == n_mgau) goto LAB_0010285f;
      pcVar7 = "# means %u inconsistent w/ cb2mllr # cb %u\n";
      lVar8 = 0xbd;
    }
  }
LAB_001029df:
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
          ,lVar8,pcVar7,uVar10);
LAB_001029e6:
  exit(1);
}

Assistant:

int
main(int argc, char *argv[])
{
    const char 	*outmeanfn, *inmeanfn;
    const char 	*outgaufn, *ingaufn;
    const char 	*mllrmatfn, *cb2mllrfn, *moddeffn;
    uint32     	cdonly, inverse;

    printf("----- Compiled on %s, %s\n\n",__DATE__,__TIME__);

    if (initialize(argc, argv) != S3_SUCCESS) {
	E_ERROR("Errors initializing.\n");
	return 0;
    }

    outmeanfn = cmd_ln_str("-outmeanfn");
    inmeanfn  = cmd_ln_str("-inmeanfn");
    outgaufn  = cmd_ln_str("-outgaucntfn");
    ingaufn   = cmd_ln_str("-ingaucntfn");
    mllrmatfn = cmd_ln_str("-mllrmat");
    cb2mllrfn = cmd_ln_str("-cb2mllrfn");
    moddeffn  = cmd_ln_str("-moddeffn");
    cdonly    = cmd_ln_int32("-cdonly");
    inverse   = cmd_ln_int32("-inverse");

    if (! (mllrmatfn && cb2mllrfn)) {
	E_FATAL("You must specify all mllr files\n");
    }
    if (outmeanfn) {
	if (mllr_adapt_mean(outmeanfn,
			    inmeanfn,
			    mllrmatfn,
			    cb2mllrfn,
			    moddeffn,
			    cdonly,
			    inverse) == S3_SUCCESS) {
	    E_INFO("mllr_adapt finished successfully.\n");
	    return(0);
	}
	else {
	    E_FATAL("Error in mllr_adapt_mean().\n");
	    return (1);
	}
    }
    else if (outgaufn) {
	if (mllr_adapt_gaucnt(outgaufn,
			      ingaufn,
			      mllrmatfn,
			      cb2mllrfn,
			      moddeffn,
			      cdonly,
			      inverse) == S3_SUCCESS) {
	    E_INFO("mllr_adapt finished successfully.\n");
	    return(0);
	}
	else {
	    E_FATAL("Error in mllr_adapt_mean().\n");
	    return (1);
	}
    }
    else {
	E_FATAL("No -outmeanfn or -outgaucntfn given, nothing done.\n");
    }
    return 0 ;
}